

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O1

void __thiscall
slang::syntax::NetDeclarationSyntax::setChild
          (NetDeclarationSyntax *this,size_t index,TokenOrSyntax child)

{
  size_type sVar1;
  Info *pIVar2;
  undefined1 uVar3;
  NumericTokenFlags NVar4;
  uint32_t uVar5;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *pSVar6;
  DataTypeSyntax *pDVar7;
  NetStrengthSyntax *pNVar8;
  variant_alternative_t<0UL,_variant<Token,_const_SyntaxNode_*>_> *pvVar9;
  TimingControlSyntax *pTVar10;
  variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_> *ppSVar11;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *pSVar12;
  logic_error *this_00;
  long *plVar13;
  size_type *psVar14;
  long *plVar15;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  undefined1 *local_90 [2];
  undefined1 local_80 [16];
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (7 < index) {
    this_00 = (logic_error *)__cxa_allocate_exception(0x10);
    local_90[0] = local_80;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_90,
               "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/build_O1/extern/slang/source/AllSyntax.cpp"
               ,"");
    plVar13 = (long *)std::__cxx11::string::append((char *)local_90);
    local_d0._M_dataplus._M_p = (pointer)*plVar13;
    psVar14 = (size_type *)(plVar13 + 2);
    if ((size_type *)local_d0._M_dataplus._M_p == psVar14) {
      local_d0.field_2._M_allocated_capacity = *psVar14;
      local_d0.field_2._8_8_ = plVar13[3];
      local_d0._M_dataplus._M_p = (pointer)&local_d0.field_2;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar14;
    }
    local_d0._M_string_length = plVar13[1];
    *plVar13 = (long)psVar14;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::__cxx11::to_string(&local_70,0x22c9);
    std::operator+(&local_50,&local_d0,&local_70);
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_50);
    local_b0 = (long *)*plVar13;
    plVar15 = plVar13 + 2;
    if (local_b0 == plVar15) {
      local_a0 = *plVar15;
      lStack_98 = plVar13[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar15;
    }
    local_a8 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    plVar13 = (long *)std::__cxx11::string::append((char *)&local_b0);
    local_f0 = (long *)*plVar13;
    plVar15 = plVar13 + 2;
    if (local_f0 == plVar15) {
      local_e0 = *plVar15;
      lStack_d8 = plVar13[3];
      local_f0 = &local_e0;
    }
    else {
      local_e0 = *plVar15;
    }
    local_e8 = plVar13[1];
    *plVar13 = (long)plVar15;
    plVar13[1] = 0;
    *(undefined1 *)(plVar13 + 2) = 0;
    std::logic_error::logic_error(this_00,(string *)&local_f0);
    __cxa_throw(this_00,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  switch(index) {
  case 0:
    ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    pSVar6 = SyntaxNode::as<slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>>
                       (*ppSVar11);
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar6->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->super_MemberSyntax).attributes.super_SyntaxListBase.childCount =
         (pSVar6->super_SyntaxListBase).childCount;
    sVar1 = (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
            size_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.data_ =
         (pSVar6->super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>).
         data_;
    (this->super_MemberSyntax).attributes.
    super_span<slang::syntax::AttributeInstanceSyntax_*,_18446744073709551615UL>.size_ = sVar1;
    break;
  case 1:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->netType).kind = pvVar9->kind;
    (this->netType).field_0x2 = uVar3;
    (this->netType).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->netType).rawLen = uVar5;
    (this->netType).info = pIVar2;
    break;
  case 2:
    ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    if (*ppSVar11 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pNVar8 = (NetStrengthSyntax *)0x0;
    }
    else {
      ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            &child);
      pNVar8 = SyntaxNode::as<slang::syntax::NetStrengthSyntax>(*ppSVar11);
    }
    this->strength = pNVar8;
    break;
  case 3:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->expansionHint).kind = pvVar9->kind;
    (this->expansionHint).field_0x2 = uVar3;
    (this->expansionHint).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->expansionHint).rawLen = uVar5;
    (this->expansionHint).info = pIVar2;
    break;
  case 4:
    ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    if (*ppSVar11 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pDVar7 = (DataTypeSyntax *)0x0;
    }
    else {
      ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            &child);
      pDVar7 = SyntaxNode::as<slang::syntax::DataTypeSyntax>(*ppSVar11);
    }
    if (pDVar7 == (DataTypeSyntax *)0x0) {
      assert::assertFailed
                ("ptr",
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Kuree[P]hgdb-rtl/extern/slang/source/../include/slang/util/NotNull.h"
                 ,0x1b,
                 "slang::not_null<slang::syntax::DataTypeSyntax *>::not_null(U &&) [T = slang::syntax::DataTypeSyntax *, U = slang::syntax::DataTypeSyntax *]"
                );
    }
    (this->type).ptr = pDVar7;
    break;
  case 5:
    ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    if (*ppSVar11 == (variant_alternative_t<1UL,_variant<Token,_const_SyntaxNode_*>_>)0x0) {
      pTVar10 = (TimingControlSyntax *)0x0;
    }
    else {
      ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                           ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                            &child);
      pTVar10 = SyntaxNode::as<slang::syntax::TimingControlSyntax>(*ppSVar11);
    }
    this->delay = pTVar10;
    break;
  case 6:
    ppSVar11 = std::get<1ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                         ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)
                          &child);
    pSVar12 = SyntaxNode::as<slang::syntax::SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>>
                        (*ppSVar11);
    (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent =
         (pSVar12->super_SyntaxListBase).super_SyntaxNode.parent;
    (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
         (pSVar12->super_SyntaxListBase).super_SyntaxNode.kind;
    (this->declarators).super_SyntaxListBase.childCount = (pSVar12->super_SyntaxListBase).childCount
    ;
    sVar1 = (pSVar12->elements).size_;
    (this->declarators).elements.data_ = (pSVar12->elements).data_;
    (this->declarators).elements.size_ = sVar1;
    break;
  case 7:
    pvVar9 = std::get<0ul,slang::parsing::Token,slang::syntax::SyntaxNode_const*>
                       ((variant<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> *)&child)
    ;
    uVar3 = pvVar9->field_0x2;
    NVar4.raw = (pvVar9->numFlags).raw;
    uVar5 = pvVar9->rawLen;
    pIVar2 = pvVar9->info;
    (this->semi).kind = pvVar9->kind;
    (this->semi).field_0x2 = uVar3;
    (this->semi).numFlags = (NumericTokenFlags)NVar4.raw;
    (this->semi).rawLen = uVar5;
    (this->semi).info = pIVar2;
  }
  return;
}

Assistant:

void NetDeclarationSyntax::setChild(size_t index, TokenOrSyntax child) {
    switch (index) {
        case 0: attributes = child.node()->as<SyntaxList<AttributeInstanceSyntax>>(); return;
        case 1: netType = child.token(); return;
        case 2: strength = child.node() ? &child.node()->as<NetStrengthSyntax>() : nullptr; return;
        case 3: expansionHint = child.token(); return;
        case 4: type = child.node() ? &child.node()->as<DataTypeSyntax>() : nullptr; return;
        case 5: delay = child.node() ? &child.node()->as<TimingControlSyntax>() : nullptr; return;
        case 6: declarators = child.node()->as<SeparatedSyntaxList<DeclaratorSyntax>>(); return;
        case 7: semi = child.token(); return;
        default: ASSUME_UNREACHABLE;
    }
}